

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

double house(double *x,int N,double *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *C;
  ulong uVar4;
  uint uVar5;
  double local_38;
  
  C = (double *)malloc(8);
  if (N < 2) {
    *C = 0.0;
  }
  else {
    mmult(x + 1,x + 1,C,1,N + -1,1);
  }
  *v = 1.0;
  if (1 < N) {
    uVar4 = 1;
    do {
      v[uVar4] = x[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)N != uVar4);
  }
  dVar1 = *C;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
LAB_0011e40a:
    dVar3 = *x * *x + dVar1;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar2 = *x;
    dVar3 = (double)(-(ulong)(0.0 < dVar2) & (ulong)(-dVar1 / (dVar3 + dVar2)) |
                    ~-(ulong)(0.0 < dVar2) & (ulong)(dVar2 - dVar3));
    *v = dVar3;
    local_38 = ((dVar3 + dVar3) * dVar3) / (dVar3 * dVar3 + dVar1);
    if (0 < N) {
      uVar4 = 0;
      do {
        v[uVar4] = v[uVar4] / dVar3;
        uVar4 = uVar4 + 1;
      } while ((uint)N != uVar4);
    }
  }
  else {
    if (0.0 <= *x) {
      uVar5 = 0;
    }
    else {
      if (0.0 <= *x) goto LAB_0011e40a;
      uVar5 = 0xc0000000;
    }
    local_38 = (double)((ulong)uVar5 << 0x20);
  }
  free(C);
  return local_38;
}

Assistant:

double house(double*x,int N,double *v) {
	double beta;
	beta = house_1(x,N,v);
	return beta;
}